

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O1

Box2i __thiscall
Imf_2_5::dataWindowForTile
          (Imf_2_5 *this,TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int dx,int dy
          ,int lx,int ly)

{
  int iVar1;
  int iVar2;
  int extraout_var;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Box2i BVar8;
  
  iVar4 = tileDesc->xSize * dx + minX;
  iVar5 = tileDesc->ySize * dy + minY;
  iVar6 = tileDesc->xSize + iVar4 + -1;
  iVar7 = (tileDesc->ySize - 1) + iVar5;
  iVar1 = levelSize(minX,maxX,lx,tileDesc->roundingMode);
  BVar8.max.y = extraout_var;
  BVar8.max.x = iVar1;
  iVar2 = levelSize(minY,maxY,ly,tileDesc->roundingMode);
  iVar3 = minX + iVar1 + -1;
  iVar1 = iVar2 + minY + -1;
  if (iVar3 < iVar6) {
    iVar6 = iVar3;
  }
  if (iVar1 < iVar7) {
    iVar7 = iVar1;
  }
  *(int *)this = iVar4;
  *(int *)(this + 4) = iVar5;
  *(int *)(this + 8) = iVar6;
  *(int *)(this + 0xc) = iVar7;
  BVar8.min = (Vec2<int>)this;
  return BVar8;
}

Assistant:

Box2i
dataWindowForTile (const TileDescription &tileDesc,
		   int minX, int maxX,
		   int minY, int maxY,
		   int dx, int dy,
		   int lx, int ly)
{
    V2i tileMin = V2i (minX + dx * tileDesc.xSize,
		       minY + dy * tileDesc.ySize);

    V2i tileMax = tileMin + V2i (tileDesc.xSize - 1, tileDesc.ySize - 1);

    V2i levelMax = dataWindowForLevel
		       (tileDesc, minX, maxX, minY, maxY, lx, ly).max;

    tileMax = V2i (std::min (tileMax[0], levelMax[0]),
		   std::min (tileMax[1], levelMax[1]));

    return Box2i (tileMin, tileMax);
}